

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumDotsTexture *
pbrt::SpectrumDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumDotsTexture *pSVar3;
  uintptr_t iptr;
  TextureMapping2DHandle map;
  undefined1 local_98 [16];
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_88;
  SpectrumHandle local_80 [2];
  long local_70 [2];
  _Base_ptr *local_60 [2];
  _Base_ptr local_50 [2];
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  
  TextureMapping2DHandle::Create
            ((TextureMapping2DHandle *)&local_88,parameters->dict,renderFromTexture,loc,alloc);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 0x3f800000;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"inside","");
  local_38 = CONCAT44(extraout_var_00,iVar2) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_98 + 8),(string *)parameters,
             (SpectrumHandle *)local_60,(SpectrumType)&local_38,(Allocator)0x0);
  local_80[0].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"outside","");
  local_40 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_98,(string *)parameters,local_80,
             (SpectrumType)&local_40,(Allocator)0x0);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pSVar3 = (SpectrumDotsTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar3->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = local_88.bits;
  (pSVar3->outsideDot).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_98._8_8_;
  (pSVar3->insideDot).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_98._0_8_;
  if (local_80[0].
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits != (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                )local_70) {
    operator_delete((void *)local_80[0].
                            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                            .bits,local_70[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],(ulong)((long)&local_50[0]->_M_color + 1));
  }
  return pSVar3;
}

Assistant:

SpectrumDotsTexture *SpectrumDotsTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    return alloc.new_object<SpectrumDotsTexture>(
        map,
        parameters.GetSpectrumTexture("inside", one, SpectrumType::Reflectance, alloc),
        parameters.GetSpectrumTexture("outside", zero, SpectrumType::Reflectance, alloc));
}